

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 GenStateCompileChunk(jx9_gen_state *pGen,sxi32 iFlags)

{
  int iVar1;
  sxi32 sVar2;
  sxi32 sVar3;
  long lVar4;
  code *pcVar5;
  SyToken *pSVar6;
  
  pSVar6 = pGen->pIn;
  sVar3 = 0;
  if (pSVar6 < pGen->pEnd) {
    while ((pSVar6->nType & 4) == 0) {
LAB_00123cdd:
      sVar2 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      sVar3 = -3;
      if (sVar2 != -3) {
        jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
        sVar3 = sVar2;
LAB_00123d36:
        if (sVar3 == -10) goto LAB_00123d89;
      }
      pSVar6 = pGen->pIn;
      while ((pSVar6 < pGen->pEnd && ((pSVar6->nType & 0x40000) != 0))) {
        pGen->pIn = pSVar6 + 1;
        pSVar6 = pSVar6 + 1;
      }
      if ((iFlags & 1U) != 0) {
        return sVar3;
      }
      if (pGen->pEnd <= pSVar6) {
        return sVar3;
      }
    }
    iVar1 = *(int *)&pSVar6->pUserData;
    lVar4 = 8;
    do {
      if (*(int *)((long)&aOpTable[0x31].iAssoc + lVar4) == iVar1) {
        pcVar5 = *(code **)((long)&aLangConstruct[0].nID + lVar4);
        if (pcVar5 != (code *)0x0) goto LAB_00123d31;
        break;
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0xe8);
    if ((iVar1 - 0xdU < 4) || (iVar1 == 2)) goto LAB_00123cdd;
    sVar3 = jx9GenCompileError(pGen,1,pSVar6->nLine,"Syntax error: Unexpected keyword \'%z\'");
    pcVar5 = jx9ErrorRecover;
    if (sVar3 != -10) {
LAB_00123d31:
      sVar3 = (*pcVar5)(pGen);
      goto LAB_00123d36;
    }
LAB_00123d89:
    sVar3 = -10;
  }
  return sVar3;
}

Assistant:

static sxi32 GenStateCompileChunk(
	jx9_gen_state *pGen, /* Code generator state */
	sxi32 iFlags             /* Compile flags */
	)
{
	ProcLangConstruct xCons;
	sxi32 rc;
	rc = SXRET_OK; /* Prevent compiler warning */
	for(;;){
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		xCons = 0;
		if( pGen->pIn->nType & JX9_TK_KEYWORD ){
			sxu32 nKeyword = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
			/* Try to extract a language construct handler */
			xCons = GenStateGetStatementHandler(nKeyword);
			if( xCons == 0 && !jx9IsLangConstruct(nKeyword) ){
				rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine,
					"Syntax error: Unexpected keyword '%z'",
					&pGen->pIn->sData);
				if( rc == SXERR_ABORT ){
					break;
				}
				/* Synchronize with the first semi-colon and avoid compiling
				 * this erroneous statement.
				 */
				xCons = jx9ErrorRecover;
			}
		}
		if( xCons == 0 ){
			/* Assume an expression an try to compile it */
			rc = jx9CompileExpr(&(*pGen), 0, 0);
			if(  rc != SXERR_EMPTY ){
				/* Pop l-value */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
			}
		}else{
			/* Go compile the sucker */
			rc = xCons(&(*pGen));
		}
		if( rc == SXERR_ABORT ){
			/* Request to abort compilation */
			break;
		}
		/* Ignore trailing semi-colons ';' */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) ){
			pGen->pIn++;
		}
		if( iFlags & JX9_COMPILE_SINGLE_STMT ){
			/* Compile a single statement and return */
			break;
		}
		/* LOOP ONE */
		/* LOOP TWO */
		/* LOOP THREE */
		/* LOOP FOUR */
	}
	/* Return compilation status */
	return rc;
}